

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Integrator.cpp
# Opt level: O2

void __thiscall OpenMD::Integrator::Integrator(Integrator *this,SimInfo *info)

{
  Globals **ppGVar1;
  double *pdVar2;
  double dVar3;
  Velocitizer *pVVar4;
  RNEMDParameters *pRVar5;
  RNEMD *pRVar6;
  FluctuatingChargeParameters *pFVar7;
  _Alloc_hider _Var8;
  bool bVar9;
  int iVar10;
  Globals *pGVar11;
  SPFForceManager *this_00;
  ForceManager *this_01;
  RotationAlgorithm *pRVar12;
  Rattle *this_02;
  FluctuatingChargeLangevin *this_03;
  undefined **ppuVar13;
  double *pdVar14;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *input;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *input_00;
  SimInfo *info_local;
  MethodFactory rnemdMethod;
  MethodFactory local_68;
  locale local_48 [8];
  double local_40;
  undefined8 local_38;
  
  this->_vptr_Integrator = (_func_int **)&PTR__Integrator_002c5688;
  this->info_ = info;
  ppGVar1 = &this->simParams;
  this->simParams = (Globals *)0x0;
  this->forceMan_ = (ForceManager *)0x0;
  this->rotAlgo_ = (RotationAlgorithm *)0x0;
  this->flucQ_ = (FluctuatingChargePropagator *)0x0;
  this->rattle_ = (Rattle *)0x0;
  (this->velocitizer_)._M_t.
  super___uniq_ptr_impl<OpenMD::Velocitizer,_std::default_delete<OpenMD::Velocitizer>_>._M_t.
  super__Tuple_impl<0UL,_OpenMD::Velocitizer_*,_std::default_delete<OpenMD::Velocitizer>_>.
  super__Head_base<0UL,_OpenMD::Velocitizer_*,_false>._M_head_impl = (Velocitizer *)0x0;
  *(undefined8 *)
   ((long)&(this->velocitizer_)._M_t.
           super___uniq_ptr_impl<OpenMD::Velocitizer,_std::default_delete<OpenMD::Velocitizer>_>.
           _M_t.
           super__Tuple_impl<0UL,_OpenMD::Velocitizer_*,_std::default_delete<OpenMD::Velocitizer>_>.
           super__Head_base<0UL,_OpenMD::Velocitizer_*,_false>._M_head_impl + 5) = 0;
  *(undefined8 *)
   ((long)&(this->rnemd_)._M_t.
           super___uniq_ptr_impl<OpenMD::RNEMD::RNEMD,_std::default_delete<OpenMD::RNEMD::RNEMD>_>.
           _M_t.
           super__Tuple_impl<0UL,_OpenMD::RNEMD::RNEMD_*,_std::default_delete<OpenMD::RNEMD::RNEMD>_>
           .super__Head_base<0UL,_OpenMD::RNEMD::RNEMD_*,_false>._M_head_impl + 5) = 0;
  this->statWriter = (StatWriter *)0x0;
  this->stats = (Stats *)0x0;
  this->dumpWriter = (DumpWriter *)0x0;
  (this->thermo).info_ = info;
  this->snap = info->sman_->currentSnapshot_;
  (this->progressBar)._M_t.
  super___uniq_ptr_impl<OpenMD::ProgressBar,_std::default_delete<OpenMD::ProgressBar>_>._M_t.
  super__Tuple_impl<0UL,_OpenMD::ProgressBar_*,_std::default_delete<OpenMD::ProgressBar>_>.
  super__Head_base<0UL,_OpenMD::ProgressBar_*,_false>._M_head_impl = (ProgressBar *)0x0;
  this->dtEps = 0.0001;
  pGVar11 = info->simParams_;
  this->simParams = pGVar11;
  if ((pGVar11->Dt).super_ParameterBase.empty_ == false) {
    dVar3 = (pGVar11->Dt).data_;
    this->dt = dVar3;
    this->dt2 = dVar3 * 0.5;
  }
  else {
    builtin_strncpy(painCave.errMsg + 0x10,": dt is not set\n",0x11);
    builtin_strncpy(painCave.errMsg,"Integrator Error",0x10);
    painCave.isFatal = 1;
    simError();
    pGVar11 = *ppGVar1;
  }
  if ((pGVar11->RunTime).super_ParameterBase.empty_ == false) {
    this->runTime = (pGVar11->RunTime).data_;
  }
  else {
    builtin_strncpy(painCave.errMsg,"Integrator Error: runTime is not set\n",0x26);
    painCave.isFatal = 1;
    simError();
    pGVar11 = *ppGVar1;
  }
  pdVar2 = &(pGVar11->RunTime).data_;
  pdVar14 = &(pGVar11->SampleTime).data_;
  if ((pGVar11->SampleTime).super_ParameterBase.empty_ != false) {
    pdVar14 = pdVar2;
  }
  dVar3 = *pdVar14;
  this->sampleTime = dVar3;
  this->statusTime = dVar3;
  if ((pGVar11->StatusTime).super_ParameterBase.empty_ == false) {
    this->statusTime = (pGVar11->StatusTime).data_;
  }
  pdVar14 = &(pGVar11->ThermalTime).data_;
  if ((pGVar11->ThermalTime).super_ParameterBase.empty_ != false) {
    pdVar14 = pdVar2;
  }
  this->thermalTime = *pdVar14;
  if ((pGVar11->UseInitalTime).super_ParameterBase.field_0x2b == '\0') {
    Snapshot::setTime(this->snap,0.0);
    pGVar11 = *ppGVar1;
  }
  if ((pGVar11->ResetTime).super_ParameterBase.empty_ == false) {
    this->needReset = true;
    this->resetTime = (pGVar11->ResetTime).data_;
  }
  this->needVelocityScaling = false;
  if (((pGVar11->TempSet).super_ParameterBase.empty_ == false) &&
     (bVar9 = (bool)(pGVar11->TempSet).super_ParameterBase.field_0x2b,
     this->needVelocityScaling = bVar9, bVar9 == true)) {
    if ((pGVar11->TargetTemp).super_ParameterBase.empty_ == false) {
      this->targetScalingTemp = (pGVar11->TargetTemp).data_;
    }
    else {
      memcpy(&painCave,"Integrator Error: Target Temperature must be set to turn on tempSet\n",0x45)
      ;
      painCave.isFatal = 1;
      simError();
    }
  }
  std::make_unique<OpenMD::Velocitizer,OpenMD::SimInfo*&>((SimInfo **)&rnemdMethod);
  _Var8 = rnemdMethod.methodStr_._M_dataplus;
  rnemdMethod.methodStr_._M_dataplus._M_p = (pointer)0x0;
  pVVar4 = (this->velocitizer_)._M_t.
           super___uniq_ptr_impl<OpenMD::Velocitizer,_std::default_delete<OpenMD::Velocitizer>_>.
           _M_t.
           super__Tuple_impl<0UL,_OpenMD::Velocitizer_*,_std::default_delete<OpenMD::Velocitizer>_>.
           super__Head_base<0UL,_OpenMD::Velocitizer_*,_false>._M_head_impl;
  (this->velocitizer_)._M_t.
  super___uniq_ptr_impl<OpenMD::Velocitizer,_std::default_delete<OpenMD::Velocitizer>_>._M_t.
  super__Tuple_impl<0UL,_OpenMD::Velocitizer_*,_std::default_delete<OpenMD::Velocitizer>_>.
  super__Head_base<0UL,_OpenMD::Velocitizer_*,_false>._M_head_impl = (Velocitizer *)_Var8._M_p;
  if (pVVar4 != (Velocitizer *)0x0) {
    (*pVVar4->_vptr_Velocitizer[1])();
    if (rnemdMethod.methodStr_._M_dataplus._M_p != (pointer)0x0) {
      (**(code **)(*(long *)rnemdMethod.methodStr_._M_dataplus._M_p + 8))();
    }
  }
  pRVar5 = (*ppGVar1)->rnemdPars_;
  if (((pRVar5->UseRNEMD).super_ParameterBase.empty_ == false) &&
     (bVar9 = (bool)(pRVar5->UseRNEMD).super_ParameterBase.field_0x2b, this->useRNEMD = bVar9,
     bVar9 == true)) {
    std::__cxx11::string::string((string *)&local_68,(string *)&(pRVar5->Method).data_);
    Utils::traits_cast<OpenMD::Utils::ci_char_traits,std::char_traits<char>>
              (&rnemdMethod.methodStr_,(Utils *)&local_68,input);
    bVar9 = std::operator==(&rnemdMethod.methodStr_,"SPF");
    std::__cxx11::basic_string<char,_OpenMD::Utils::ci_char_traits,_std::allocator<char>_>::
    ~basic_string(&rnemdMethod.methodStr_);
    std::__cxx11::string::~string((string *)&local_68);
    if (bVar9) {
      this_00 = (SPFForceManager *)operator_new(0xd68);
      RNEMD::SPFForceManager::SPFForceManager(this_00,info);
      this->forceMan_ = (ForceManager *)this_00;
    }
    std::__cxx11::string::string
              ((string *)&local_68,(string *)&((*ppGVar1)->rnemdPars_->Method).data_);
    Utils::traits_cast<OpenMD::Utils::ci_char_traits,std::char_traits<char>>
              ((basic_string<char,_OpenMD::Utils::ci_char_traits,_std::allocator<char>_> *)
               &rnemdMethod,(Utils *)&local_68,input_00);
    std::__cxx11::string::~string((string *)&local_68);
    RNEMD::MethodFactory::create(&local_68,(SimInfo *)&rnemdMethod,(ForceManager *)info);
    _Var8._M_p = local_68.methodStr_._M_dataplus._M_p;
    local_68.methodStr_._M_dataplus._M_p = (pointer)0x0;
    pRVar6 = (this->rnemd_)._M_t.
             super___uniq_ptr_impl<OpenMD::RNEMD::RNEMD,_std::default_delete<OpenMD::RNEMD::RNEMD>_>
             ._M_t.
             super__Tuple_impl<0UL,_OpenMD::RNEMD::RNEMD_*,_std::default_delete<OpenMD::RNEMD::RNEMD>_>
             .super__Head_base<0UL,_OpenMD::RNEMD::RNEMD_*,_false>._M_head_impl;
    (this->rnemd_)._M_t.
    super___uniq_ptr_impl<OpenMD::RNEMD::RNEMD,_std::default_delete<OpenMD::RNEMD::RNEMD>_>._M_t.
    super__Tuple_impl<0UL,_OpenMD::RNEMD::RNEMD_*,_std::default_delete<OpenMD::RNEMD::RNEMD>_>.
    super__Head_base<0UL,_OpenMD::RNEMD::RNEMD_*,_false>._M_head_impl = (RNEMD *)_Var8._M_p;
    if (pRVar6 != (RNEMD *)0x0) {
      (*pRVar6->_vptr_RNEMD[1])();
      if ((RNEMD *)local_68.methodStr_._M_dataplus._M_p != (RNEMD *)0x0) {
        (**(code **)(*(long *)local_68.methodStr_._M_dataplus._M_p + 8))();
      }
    }
    if (((*ppGVar1)->rnemdPars_->ExchangeTime).super_ParameterBase.empty_ == false) {
      local_38 = ((*ppGVar1)->rnemdPars_->ExchangeTime).data_;
      this->RNEMD_exchangeTime = (RealType)local_38;
      local_40 = this->dt;
      dVar3 = ceil((double)local_38 / local_40);
      if (1e-06 < ABS(dVar3 * local_40 - (double)local_38)) {
        this->RNEMD_exchangeTime = dVar3 * local_40;
      }
    }
    std::__cxx11::basic_string<char,_OpenMD::Utils::ci_char_traits,_std::allocator<char>_>::
    ~basic_string(&rnemdMethod.methodStr_);
  }
  if (this->forceMan_ == (ForceManager *)0x0) {
    this_01 = (ForceManager *)operator_new(0xc80);
    ForceManager::ForceManager(this_01,info);
    this->forceMan_ = this_01;
  }
  pRVar12 = (RotationAlgorithm *)operator_new(8);
  ppuVar13 = &PTR__RotationAlgorithm_002c9078;
  pRVar12->_vptr_RotationAlgorithm = (_func_int **)&PTR__RotationAlgorithm_002c9078;
  this->rotAlgo_ = pRVar12;
  this_02 = (Rattle *)operator_new(0x68);
  Rattle::Rattle(this_02,info);
  this->rattle_ = this_02;
  pFVar7 = this->simParams->flucQpars_;
  if ((pFVar7->Propagator).super_ParameterBase.empty_ != false) goto LAB_0019cdce;
  std::__cxx11::string::string((string *)&local_68,(string *)&(pFVar7->Propagator).data_);
  std::locale::locale(local_48);
  toUpperCopy<std::__cxx11::string>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&rnemdMethod,
             (OpenMD *)&local_68,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_48,
             (locale *)ppuVar13);
  std::locale::~locale(local_48);
  std::__cxx11::string::~string((string *)&local_68);
  iVar10 = std::__cxx11::string::compare((char *)&rnemdMethod);
  if (iVar10 == 0) {
    this_03 = (FluctuatingChargeLangevin *)operator_new(0x88);
    FluctuatingChargeNVT::FluctuatingChargeNVT((FluctuatingChargeNVT *)this_03,info);
LAB_0019cdbd:
    this->flucQ_ = &this_03->super_FluctuatingChargePropagator;
  }
  else {
    iVar10 = std::__cxx11::string::compare((char *)&rnemdMethod);
    if (iVar10 == 0) {
      this_03 = (FluctuatingChargeLangevin *)operator_new(0x50);
      FluctuatingChargeNVE::FluctuatingChargeNVE((FluctuatingChargeNVE *)this_03,info);
      goto LAB_0019cdbd;
    }
    iVar10 = std::__cxx11::string::compare((char *)&rnemdMethod);
    if (iVar10 == 0) {
      this_03 = (FluctuatingChargeLangevin *)operator_new(0x90);
      FluctuatingChargeLangevin::FluctuatingChargeLangevin(this_03,info);
      goto LAB_0019cdbd;
    }
    iVar10 = std::__cxx11::string::compare((char *)&rnemdMethod);
    if (iVar10 == 0) {
      this_03 = (FluctuatingChargeLangevin *)operator_new(0x58);
      FluctuatingChargeDamped::FluctuatingChargeDamped((FluctuatingChargeDamped *)this_03,info);
      goto LAB_0019cdbd;
    }
    std::__cxx11::string::string
              ((string *)&local_68,(string *)&((*ppGVar1)->flucQpars_->Propagator).data_);
    snprintf(painCave.errMsg,2000,
             "Integrator Error: Unknown Fluctuating Charge propagator (%s) requested\n",
             local_68.methodStr_._M_dataplus._M_p);
    std::__cxx11::string::~string((string *)&local_68);
    painCave.isFatal = 1;
  }
  std::__cxx11::string::~string((string *)&rnemdMethod);
LAB_0019cdce:
  (*this->flucQ_->_vptr_FluctuatingChargePropagator[9])(this->flucQ_,this->forceMan_);
  return;
}

Assistant:

Integrator::Integrator(SimInfo* info) :
      info_(info), forceMan_(NULL), rotAlgo_(NULL), flucQ_(NULL), rattle_(NULL),
      velocitizer_(nullptr), needPotential(false), needVirial(false),
      needReset(false), needVelocityScaling(false), useRNEMD(false),
      dumpWriter(NULL), statWriter(NULL), thermo(info_),
      snap(info_->getSnapshotManager()->getCurrentSnapshot()) {
    simParams = info->getSimParams();

    if (simParams->haveDt()) {
      dt  = simParams->getDt();
      dt2 = 0.5 * dt;
    } else {
      snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
               "Integrator Error: dt is not set\n");
      painCave.isFatal = 1;
      simError();
    }

    if (simParams->haveRunTime()) {
      runTime = simParams->getRunTime();
    } else {
      snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
               "Integrator Error: runTime is not set\n");
      painCave.isFatal = 1;
      simError();
    }

    // set the status, sample, and thermal kick times
    if (simParams->haveSampleTime()) {
      sampleTime = simParams->getSampleTime();
      statusTime = sampleTime;
    } else {
      sampleTime = simParams->getRunTime();
      statusTime = sampleTime;
    }

    if (simParams->haveStatusTime()) {
      statusTime = simParams->getStatusTime();
    }

    if (simParams->haveThermalTime()) {
      thermalTime = simParams->getThermalTime();
    } else {
      thermalTime = simParams->getRunTime();
    }

    if (!simParams->getUseInitalTime()) { snap->setTime(0.0); }

    if (simParams->haveResetTime()) {
      needReset = true;
      resetTime = simParams->getResetTime();
    }

    // check for the temperature set flag (velocity scaling)
    needVelocityScaling = false;
    if (simParams->haveTempSet()) {
      needVelocityScaling = simParams->getTempSet();
    }

    if (needVelocityScaling) {
      if (simParams->haveTargetTemp()) {
        targetScalingTemp = simParams->getTargetTemp();
      } else {
        snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
                 "Integrator Error: Target Temperature must be set to turn on "
                 "tempSet\n");
        painCave.isFatal = 1;
        simError();
      }
    }

    // Create a default a velocitizer: If the subclass wants to use
    // a different velocitizer, use setVelocitizer
    velocitizer_ = std::make_unique<Velocitizer>(info);

    if (simParams->getRNEMDParameters()->haveUseRNEMD()) {
      useRNEMD = simParams->getRNEMDParameters()->getUseRNEMD();

      if (useRNEMD) {
        // ForceManager will only be changed if SPF-RNEMD is enabled
        if (Utils::traits_cast<Utils::ci_char_traits>(
                simParams->getRNEMDParameters()->getMethod()) == "SPF") {
          forceMan_ = new RNEMD::SPFForceManager(info);
        }

        RNEMD::MethodFactory rnemdMethod {
            simParams->getRNEMDParameters()->getMethod()};
        rnemd_ = rnemdMethod.create(info, forceMan_);

        if (simParams->getRNEMDParameters()->haveExchangeTime()) {
          RNEMD_exchangeTime =
              simParams->getRNEMDParameters()->getExchangeTime();

          // check to make sure exchange time is a multiple of dt;
          RealType newET = ceil(RNEMD_exchangeTime / dt) * dt;
          if (std::fabs(newET - RNEMD_exchangeTime) > 1e-6) {
            RNEMD_exchangeTime = newET;
          }
        }
      }
    }

    if (forceMan_ == NULL) forceMan_ = new ForceManager(info);

    rotAlgo_ = new DLM();
    rattle_  = new Rattle(info);

    if (simParams->getFluctuatingChargeParameters()->havePropagator()) {
      std::string prop = toUpperCopy(
          simParams->getFluctuatingChargeParameters()->getPropagator());
      if (prop.compare("NVT") == 0) {
        flucQ_ = new FluctuatingChargeNVT(info);
      } else if (prop.compare("NVE") == 0) {
        flucQ_ = new FluctuatingChargeNVE(info);
      } else if (prop.compare("LANGEVIN") == 0) {
        flucQ_ = new FluctuatingChargeLangevin(info);
      } else if (prop.compare("DAMPED") == 0) {
        flucQ_ = new FluctuatingChargeDamped(info);
      } else {
        snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
                 "Integrator Error: Unknown Fluctuating Charge propagator (%s) "
                 "requested\n",
                 simParams->getFluctuatingChargeParameters()
                     ->getPropagator()
                     .c_str());
        painCave.isFatal = 1;
      }
    }

    flucQ_->setForceManager(forceMan_);
  }